

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O0

Bool Ppmd8_RangeDec_Init(CPpmd8 *p)

{
  UInt32 UVar1;
  byte bVar2;
  uint local_14;
  uint i;
  CPpmd8 *p_local;
  
  p->Low = 0;
  p->Range = 0xffffffff;
  p->Code = 0;
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    UVar1 = p->Code;
    bVar2 = (*((p->Stream).In)->Read)((p->Stream).In);
    p->Code = UVar1 << 8 | (uint)bVar2;
  }
  return (Bool)(p->Code != 0xffffffff);
}

Assistant:

Bool Ppmd8_RangeDec_Init(CPpmd8 *p)
{
  unsigned i;
  p->Low = 0;
  p->Range = 0xFFFFFFFF;
  p->Code = 0;
  for (i = 0; i < 4; i++)
    p->Code = (p->Code << 8) | p->Stream.In->Read(p->Stream.In);
  return (p->Code < 0xFFFFFFFF);
}